

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::iterate(PartialUpdateTest *this)

{
  TestLog *log;
  TestContext *this_00;
  uint uVar1;
  PartialUpdateTest *pPVar2;
  int iVar3;
  pointer pFVar4;
  bool bVar5;
  bool bVar6;
  EGLint EVar7;
  deUint32 dVar8;
  Library *egl;
  ulong uVar9;
  pointer __result;
  pointer pFVar10;
  pointer pFVar11;
  ostream *poVar12;
  _Tp_alloc_type *__alloc;
  Frame *__args;
  Frame *extraout_RDX;
  size_t __n;
  Frame *extraout_RDX_00;
  Frame *pFVar13;
  Frame *extraout_RDX_01;
  Frame *frame;
  char *description;
  pointer piVar14;
  ulong uVar15;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes;
  uint frameNdx;
  ulong uVar16;
  float fVar17;
  float fVar18;
  EGLint currentBufferAge;
  PartialUpdateTest *local_2b8;
  pointer local_2b0;
  int local_2a8;
  EGLint local_2a4;
  allocator_type local_29d;
  value_type_conflict1 local_29c;
  vector<int,_std::allocator<int>_> framesOnBuffer;
  FrameSequence frameSequence;
  Frame newFrame;
  Vec4 clearColor;
  Surface refBuffer;
  vector<int,_std::allocator<int>_> bufferAges;
  Surface currentBuffer;
  Random rnd;
  ostringstream stream;
  undefined4 uStack_1a4;
  
  deRandom_init(&rnd.m_rnd,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  EVar7 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  local_2a4 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar17 = deRandom_getFloat(&rnd.m_rnd);
  fVar18 = deRandom_getFloat(&rnd.m_rnd);
  local_2b0 = (pointer)CONCAT44(local_2b0._4_4_,fVar18);
  clearColor.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
  clearColor.m_data[1] = local_2b0._0_4_;
  clearColor.m_data[3] = 1.0;
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  clearColor.m_data[0] = fVar17;
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
  dVar8 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar8,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                   ,499);
  local_2b0 = (pointer)0x0;
  bVar5 = false;
  frameNdx = 0;
  local_2b8 = this;
  local_2a8 = EVar7;
  do {
    EVar7 = local_2a4;
    iVar3 = local_2a8;
    if (frameNdx == 0x14) {
      description = "Fail, claim to support partial_update but buffer age is always 0";
      if (bVar5) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_2b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(byte)~bVar5,description);
      break;
    }
    tcu::Surface::Surface(&currentBuffer,local_2a8,local_2a4);
    tcu::Surface::Surface(&refBuffer,iVar3,EVar7);
    newFrame.height = EVar7;
    newFrame.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newFrame.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newFrame.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    currentBufferAge = -1;
    drawTypes = &this->m_oddFrameDrawType;
    if ((frameNdx & 1) == 0) {
      drawTypes = &this->m_evenFrameDrawType;
    }
    newFrame.width = iVar3;
    generateRandomFrame(&newFrame,drawTypes,&rnd);
    pFVar4 = frameSequence.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_2b0 ==
        frameSequence.
        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_2b0 -
          (long)frameSequence.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar16 = (long)local_2b0 -
               (long)frameSequence.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar9 = uVar16;
      if (local_2b0 ==
          frameSequence.
          super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar9 = 1;
      }
      uVar15 = uVar9 + uVar16;
      __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
      if (0x3fffffffffffffe < uVar15) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar9,uVar16)) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (uVar15 == 0) {
        __result = (pointer)0x0;
        pFVar13 = __args;
      }
      else {
        __result = (pointer)operator_new(uVar15 << 5);
        pFVar13 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(__result + uVar16),&newFrame,pFVar13);
      pFVar11 = local_2b0;
      pFVar10 = std::
                vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ::_S_relocate(pFVar4,local_2b0,__result,__alloc);
      pFVar11 = std::
                vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ::_S_relocate(pFVar11,pFVar11,pFVar10 + 1,__alloc);
      std::
      _Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                       *)pFVar4,
                      (pointer)((long)frameSequence.
                                      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pFVar4 >> 5),__n);
      frameSequence.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar15;
      frameSequence.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      frameSequence.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar11;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)local_2b0,&newFrame,__args);
      frameSequence.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_2b0 + 1;
    }
    local_2b0 = frameSequence.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    (*egl->_vptr_Library[0x2b])(egl,local_2b8->m_eglDisplay,local_2b8->m_eglSurface,0x313d);
    dVar8 = (*egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar8,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                     ,0x203);
    if (frameNdx < (uint)currentBufferAge) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
      poVar12 = std::operator<<((ostream *)&stream,"Fail, the age is invalid. Age: ");
      pPVar2 = local_2b8;
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,currentBufferAge);
      poVar12 = std::operator<<(poVar12,", frameNdx: ");
      std::ostream::operator<<(poVar12,frameNdx);
      this_00 = (pPVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::stringbuf::str();
      tcu::TestContext::setTestResult
                (this_00,QP_TEST_RESULT_FAIL,
                 (char *)framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&framesOnBuffer);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
LAB_00243c08:
      bVar6 = false;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back(&bufferAges,&currentBufferAge);
      pPVar2 = local_2b8;
      if (currentBufferAge < 1) {
        (*egl->_vptr_Library[0x2e])(egl,local_2b8->m_eglDisplay,local_2b8->m_eglSurface,0,0);
        dVar8 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar8,"setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x227);
        clearColorScreen(&this->m_gl,&clearColor);
      }
      else {
        _stream = (char *)0x0;
        if (local_2b8->m_supportBufferAge == true) {
          getDamageRegion(&framesOnBuffer,&newFrame,10,10,10,10);
LAB_00243d3c:
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    ((vector<int,_std::allocator<int>_> *)&stream,
                     &framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>);
        }
        else {
          getDamageRegion((vector<int,_std::allocator<int>_> *)
                          &framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>,&newFrame,0,
                          0,0,0);
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    ((vector<int,_std::allocator<int>_> *)&stream,
                     &framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>);
          if (_stream == (char *)0x0) {
            local_29c = 0;
            std::vector<int,_std::allocator<int>_>::vector(&framesOnBuffer,4,&local_29c,&local_29d);
            goto LAB_00243d3c;
          }
        }
        (*egl->_vptr_Library[0x2e])
                  (egl,pPVar2->m_eglDisplay,pPVar2->m_eglSurface,_stream,
                   (long)((ulong)(uint)((int)((ulong)-(long)_stream >> 2) >> 0x1f) << 0x20 |
                         (ulong)-(long)_stream >> 2 & 0xffffffff) / 4 & 0xffffffff);
        dVar8 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar8,
                         "setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x223);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&stream);
        bVar5 = true;
      }
      iVar3 = local_2a8;
      pPVar2 = local_2b8;
      if (frameNdx < 10) {
        GLES2Renderer::render(local_2b8->m_gles2Renderer,local_2a8,local_2a4,&newFrame);
      }
      else {
        _stream = (char *)CONCAT44(uStack_1a4,frameNdx);
        framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        uVar1 = frameNdx;
        while (bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar1] != 0) {
          _stream = (char *)CONCAT44(uStack_1a4,
                                     uVar1 - bufferAges.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[(int)uVar1]);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&framesOnBuffer,(value_type_conflict1 *)&stream);
          uVar1 = _stream;
        }
        std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        clearColorReference(&refBuffer,&clearColor);
        pFVar4 = frameSequence.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar13 = extraout_RDX_00;
        for (piVar14 = framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar14 !=
            framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar14 = piVar14 + 1) {
          ReferenceRenderer::render
                    ((ReferenceRenderer *)&refBuffer,(Surface *)(pFVar4 + *piVar14),pFVar13);
          pFVar13 = extraout_RDX_01;
        }
        GLES2Renderer::render(pPVar2->m_gles2Renderer,iVar3,local_2a4,&newFrame);
        ReferenceRenderer::render((ReferenceRenderer *)&refBuffer,(Surface *)&newFrame,frame);
        readPixels(&this->m_gl,&currentBuffer);
        bVar6 = compareToReference(log,&refBuffer,&currentBuffer,frameNdx,frameNdx);
        if (!bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stream,"Fail, render result is wrong. Buffer age is ",
                     (allocator<char> *)&local_29c);
          std::__cxx11::string::append((char *)&stream);
          tcu::TestContext::setTestResult
                    ((pPVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,_stream);
          std::__cxx11::string::~string((string *)&stream);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>);
          goto LAB_00243c08;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>);
      }
      (*egl->_vptr_Library[0x31])(egl,local_2b8->m_eglDisplay,local_2b8->m_eglSurface);
      dVar8 = (*egl->_vptr_Library[0x1f])();
      bVar6 = true;
      eglu::checkError(dVar8,"swapBuffers(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                       ,0x244);
    }
    Frame::~Frame(&newFrame);
    tcu::Surface::~Surface(&refBuffer);
    tcu::Surface::~Surface(&currentBuffer);
    frameNdx = frameNdx + 1;
  } while (bVar6);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bufferAges.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&frameSequence);
  return STOP;
}

Assistant:

TestCase::IterateResult PartialUpdateTest::iterate (void)
{
	de::Random		rnd				(m_seed);
	const Library&	egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log				= m_testCtx.getLog();
	const int		width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed		= rnd.getFloat();
	const float		clearGreen		= rnd.getFloat();
	const float		clearBlue		= rnd.getFloat();
	const tcu::Vec4	clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames		= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;
	bool			hasPositiveAge  = false;

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface	currentBuffer	 (width, height);
		tcu::Surface	refBuffer		 (width, height);
		Frame			newFrame		 (width, height);
		EGLint			currentBufferAge = -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		if (currentBufferAge > 0)
		{
			vector<EGLint>	damageRegion;

			hasPositiveAge = true;

			if (m_supportBufferAge)
			{
				damageRegion = getDamageRegion(newFrame, 10, 10, 10, 10);
			}
			else
			{
				damageRegion = getDamageRegion(newFrame, 0, 0, 0, 0);
				// Set empty damage region to avoid invalidating the framebuffer. The damage area is invalidated
				// if the buffer age extension is not supported.
				if (damageRegion.size() == 0)
					damageRegion = vector<EGLint>(4, 0);
			}

			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));
		}
		else
		{
			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0));
			clearColorScreen(m_gl, clearColor);
		}

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
			m_gles2Renderer->render(width, height, newFrame);
		else // do verification in the second half
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);

			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			m_gles2Renderer->render(width, height, newFrame);
			m_refRenderer->render(&refBuffer, newFrame);

			readPixels(m_gl, &currentBuffer);

			if (!compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx))
			{
				string errorMessage("Fail, render result is wrong. Buffer age is ");
				errorMessage += (m_supportBufferAge ? "supported" : "not supported");
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, errorMessage.c_str());
				return STOP;
			}
		}
		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));
	}

	if (!hasPositiveAge) // fraud behavior, pretend to support partial_update
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, claim to support partial_update but buffer age is always 0");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}